

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O0

bool duckdb_yyjson::yyjson_val_write_fp
               (FILE *fp,yyjson_val *val,yyjson_write_flag flg,yyjson_alc *alc_ptr,
               yyjson_write_err *err)

{
  u8 *puVar1;
  bool bVar2;
  char *pcVar3;
  undefined **in_RCX;
  long in_RDI;
  u8 *in_R8;
  bool suc;
  yyjson_val *root;
  usize dat_len;
  u8 *dat;
  yyjson_write_err dummy_err;
  yyjson_write_err *in_stack_00000470;
  usize *in_stack_00000478;
  yyjson_alc *in_stack_00000480;
  yyjson_write_flag in_stack_0000048c;
  yyjson_val *in_stack_00000490;
  usize in_stack_ffffffffffffff88;
  u8 local_40 [16];
  u8 *local_30;
  FILE *local_28;
  bool local_1;
  
  if ((FILE *)in_RCX == (FILE *)0x0) {
    in_RCX = &YYJSON_DEFAULT_ALC;
  }
  if (in_R8 == (u8 *)0x0) {
    in_R8 = local_40;
  }
  local_30 = in_R8;
  if (in_RDI == 0) {
    *(char **)(in_R8 + 8) = "input fp is invalid";
    puVar1 = local_30;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    local_1 = false;
  }
  else {
    local_28 = (FILE *)in_RCX;
    pcVar3 = yyjson_val_write_opts
                       (in_stack_00000490,in_stack_0000048c,in_stack_00000480,in_stack_00000478,
                        in_stack_00000470);
    if (pcVar3 == (char *)0x0) {
      local_1 = false;
    }
    else {
      bVar2 = write_dat_to_fp((FILE *)in_RCX,in_R8,in_stack_ffffffffffffff88,
                              (yyjson_write_err *)0x27bb5f6);
      (**(code **)(local_28 + 0x10))(*(undefined **)(local_28 + 0x18),pcVar3);
      local_1 = bVar2;
    }
  }
  return local_1;
}

Assistant:

bool yyjson_val_write_fp(FILE *fp,
                         const yyjson_val *val,
                         yyjson_write_flag flg,
                         const yyjson_alc *alc_ptr,
                         yyjson_write_err *err) {
    yyjson_write_err dummy_err;
    u8 *dat;
    usize dat_len = 0;
    yyjson_val *root = constcast(yyjson_val *)val;
    bool suc;

    alc_ptr = alc_ptr ? alc_ptr : &YYJSON_DEFAULT_ALC;
    err = err ? err : &dummy_err;
    if (unlikely(!fp)) {
        err->msg = "input fp is invalid";
        err->code = YYJSON_READ_ERROR_INVALID_PARAMETER;
        return false;
    }

    dat = (u8 *)yyjson_val_write_opts(root, flg, alc_ptr, &dat_len, err);
    if (unlikely(!dat)) return false;
    suc = write_dat_to_fp(fp, dat, dat_len, err);
    alc_ptr->free(alc_ptr->ctx, dat);
    return suc;
}